

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

HTS_Boolean HTS_get_pattern_token(HTS_File *fp,char *buff)

{
  HTS_Boolean HVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  
  if (fp == (HTS_File *)0x0) {
    return '\0';
  }
  do {
    iVar2 = HTS_feof(fp);
    if (iVar2 != 0) goto LAB_00146617;
    uVar3 = HTS_fgetc(fp);
    iVar2 = uVar3 << 0x18;
  } while ((iVar2 == 0x20000000) || (iVar2 == 0xa000000));
  if (iVar2 == 0x27000000) {
    iVar4 = HTS_feof(fp);
    if (iVar4 == 0) {
      uVar3 = HTS_fgetc(fp);
      goto LAB_00146601;
    }
LAB_00146617:
    HVar1 = '\0';
  }
  else {
LAB_00146601:
    uVar6 = uVar3 & 0xff;
    if (uVar6 == 0x22) {
      iVar4 = HTS_feof(fp);
      if (iVar4 != 0) goto LAB_00146617;
      uVar3 = HTS_fgetc(fp);
    }
    if ((char)uVar3 == ',') {
      buff[0] = ',';
      buff[1] = '\0';
    }
    else {
      pcVar5 = buff + 1;
      while( true ) {
        pcVar5[-1] = (char)uVar3;
        uVar3 = HTS_fgetc(fp);
        iVar4 = uVar3 << 0x18;
        if (((iVar4 == 0x27000000 && iVar2 == 0x27000000) || (iVar4 == 0x22000000 && uVar6 == 0x22))
           || ((iVar2 != 0x27000000 && uVar6 != 0x22 &&
               (((iVar4 == 0xa000000 || (iVar4 == 0x20000000)) || (iVar4 = HTS_feof(fp), iVar4 != 0)
                ))))) break;
        pcVar5 = pcVar5 + 1;
      }
      *pcVar5 = '\0';
    }
    HVar1 = '\x01';
  }
  return HVar1;
}

Assistant:

HTS_Boolean HTS_get_pattern_token(HTS_File * fp, char *buff)
{
   char c;
   size_t i;
   HTS_Boolean squote = FALSE, dquote = FALSE;

   if (fp == NULL || HTS_feof(fp))
      return FALSE;
   c = HTS_fgetc(fp);

   while (c == ' ' || c == '\n') {
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
   }

   if (c == '\'') {             /* single quote case */
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      squote = TRUE;
   }

   if (c == '\"') {             /*double quote case */
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      dquote = TRUE;
   }

   if (c == ',') {              /*special character ',' */
      strcpy(buff, ",");
      return TRUE;
   }

   i = 0;
   while (1) {
      buff[i++] = c;
      c = HTS_fgetc(fp);
      if (squote && c == '\'')
         break;
      if (dquote && c == '\"')
         break;
      if (!squote && !dquote) {
         if (c == ' ')
            break;
         if (c == '\n')
            break;
         if (HTS_feof(fp))
            break;
      }
   }

   buff[i] = '\0';
   return TRUE;
}